

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O1

void __thiscall sc_dt::scfx_rep::scfx_rep(scfx_rep *this,sc_unsigned *a)

{
  uint *puVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  word *pwVar5;
  sc_unsigned_bitref_r *this_00;
  uint64 uVar6;
  long lVar7;
  long lVar8;
  uint i;
  int iVar9;
  
  (this->m_mant).m_array = (word *)0x0;
  (this->m_mant).m_size = 4;
  pwVar5 = scfx_mant::alloc_word(4);
  (this->m_mant).m_array = pwVar5;
  this->m_wp = 0;
  this->m_sign = 0;
  this->m_state = normal;
  this->m_msw = 0;
  *(undefined8 *)((long)&this->m_msw + 1) = 0;
  bVar4 = sc_unsigned::iszero(a);
  if (bVar4) {
    if (0 < (this->m_mant).m_size) {
      pwVar5 = (this->m_mant).m_array;
      lVar8 = 0;
      do {
        pwVar5[lVar8] = 0;
        lVar8 = lVar8 + 1;
      } while (lVar8 < (this->m_mant).m_size);
    }
    this->m_lsw = 0;
    this->m_wp = 0;
    this->m_sign = 1;
    this->m_state = normal;
    this->m_msw = 0;
  }
  else {
    iVar2 = a->nbits + 0x1e;
    iVar9 = a->nbits + 0x3d;
    if (-1 < iVar2) {
      iVar9 = iVar2;
    }
    iVar9 = iVar9 >> 5;
    if ((this->m_mant).m_size < iVar9) {
      if ((this->m_mant).m_array == (word *)0x0) {
        (this->m_mant).m_size = iVar9;
        pwVar5 = scfx_mant::alloc_word((long)iVar9);
        (this->m_mant).m_array = pwVar5;
      }
      else {
        pwVar5 = scfx_mant::alloc_word((long)iVar9);
        scfx_mant::free_word((this->m_mant).m_array,(long)(this->m_mant).m_size);
        (this->m_mant).m_array = pwVar5;
        (this->m_mant).m_size = iVar9;
      }
    }
    if (0 < (this->m_mant).m_size) {
      pwVar5 = (this->m_mant).m_array;
      lVar8 = 0;
      do {
        pwVar5[lVar8] = 0;
        lVar8 = lVar8 + 1;
      } while (lVar8 < (this->m_mant).m_size);
    }
    lVar8 = 0;
    this->m_wp = 0;
    this->m_state = normal;
    if (1 < a->nbits) {
      i = 0;
      do {
        this_00 = sc_unsigned::operator[](a,i);
        uVar6 = sc_unsigned_bitref_r::operator_cast_to_unsigned_long_long(this_00);
        if (uVar6 != 0) {
          puVar1 = (this->m_mant).m_array + (int)((i >> 5) + this->m_wp);
          *puVar1 = *puVar1 | 1 << ((byte)i & 0x1f);
        }
        i = i + 1;
      } while ((int)i < a->nbits + -1);
    }
    this->m_sign = 1;
    lVar7 = (long)(this->m_mant).m_size;
    if (0 < lVar7) {
      lVar8 = 0;
      do {
        if ((this->m_mant).m_array[lVar8] != 0) goto LAB_001c18ef;
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
      lVar8 = 0;
    }
LAB_001c18ef:
    this->m_lsw = (int)lVar8;
    do {
      if (lVar7 < 1) {
        lVar8 = 0;
        break;
      }
      lVar8 = lVar7 + -1;
      lVar3 = lVar7 + -1;
      lVar7 = lVar8;
    } while ((this->m_mant).m_array[lVar3] == 0);
    this->m_msw = (int)lVar8;
  }
  return;
}

Assistant:

scfx_rep::scfx_rep( const sc_unsigned& a )
: m_mant( min_mant ), m_wp(), m_sign(), m_state(), m_msw(), m_lsw(),
  m_r_flag( false )
{
    if( a.iszero() )
	set_zero();
    else
    {
	int words = n_word( a.length() );
	if( words > size() )
	    resize_to( words );
	m_mant.clear();
	m_wp = 0;
	m_state = normal;
	for( int i = 0; i < a.length(); ++ i )
	{
	    if( a[i] )
	    {
		scfx_index x = calc_indices( i );
		m_mant[x.wi()] |= 1 << x.bi();
	    }
	}
	m_sign = 1;
	find_sw();
    }
}